

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.c
# Opt level: O0

ecs_entity_t *
ecs_bulk_new_w_data(ecs_world_t *world,int32_t count,ecs_entities_t *components,void *data)

{
  _Bool _Var1;
  ecs_type_t type_00;
  ecs_table_t *table_00;
  ecs_table_t *table;
  ecs_type_t type;
  ecs_entity_t *ids;
  ecs_stage_t *stage;
  void *data_local;
  ecs_entities_t *components_local;
  ecs_world_t *peStack_18;
  int32_t count_local;
  ecs_world_t *world_local;
  
  stage = (ecs_stage_t *)data;
  data_local = components;
  components_local._4_4_ = count;
  peStack_18 = world;
  ids = (ecs_entity_t *)ecs_get_stage(&stack0xffffffffffffffe8);
  _Var1 = ecs_defer_bulk_new(peStack_18,(ecs_stage_t *)ids,components_local._4_4_,
                             (ecs_entities_t *)data_local,&stage->world,(ecs_entity_t **)&type);
  if (_Var1) {
    world_local = (ecs_world_t *)type;
  }
  else {
    type_00 = ecs_type_find(peStack_18,*data_local,*(int32_t *)((long)data_local + 8));
    table_00 = ecs_table_from_type(peStack_18,type_00);
    type = (ecs_type_t)
           new_w_data(peStack_18,table_00,(ecs_entities_t *)0x0,components_local._4_4_,&stage->world
                      ,(int32_t *)0x0);
    ecs_defer_flush(peStack_18,(ecs_stage_t *)ids);
    world_local = (ecs_world_t *)type;
  }
  return (ecs_entity_t *)world_local;
}

Assistant:

const ecs_entity_t* ecs_bulk_new_w_data(
    ecs_world_t *world,
    int32_t count,
    ecs_entities_t * components,
    void * data)
{
    ecs_stage_t *stage = ecs_get_stage(&world);
    const ecs_entity_t *ids;
    if (ecs_defer_bulk_new(world, stage, count, components, data, &ids)) {
        return ids;
    }
    ecs_type_t type = ecs_type_find(world, components->array, components->count);
    ecs_table_t *table = ecs_table_from_type(world, type);    
    ids = new_w_data(world, table, NULL, count, data, NULL);
    ecs_defer_flush(world, stage);
    return ids;
}